

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O2

S2CellId __thiscall S2CellId::child_begin(S2CellId *this,int level)

{
  ulong uVar1;
  int iVar2;
  S2LogMessage local_20;
  
  uVar1 = this->id_;
  if (((uint)(uVar1 >> 0x3e) < 3) && ((uVar1 & 0x1555555555555555 & -uVar1) != 0)) {
    iVar2 = S2CellId::level(this);
    if (level < iVar2) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x284,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_20.stream_,"Check failed: (level) >= (this->level()) ");
    }
    else {
      if (level < 0x1f) {
        return (S2CellId)((1L << ((char)level * -2 + 0x3cU & 0x3f)) + (this->id_ - 1 & this->id_));
      }
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x285,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_20.stream_,"Check failed: (level) <= (kMaxLevel) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x283,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_20.stream_,"Check failed: is_valid() ");
  }
  abort();
}

Assistant:

inline int S2CellId::face() const {
  return id_ >> kPosBits;
}